

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimension2d.h
# Opt level: O3

void __thiscall
irr::scene::CBillboardSceneNode::setSize
          (CBillboardSceneNode *this,f32 height,f32 bottomEdgeWidth,f32 topEdgeWidth)

{
  float fVar1;
  float fVar2;
  
  (this->Size).Width = (float)bottomEdgeWidth;
  (this->Size).Height = (float)height;
  this->TopEdgeWidth = topEdgeWidth;
  if (ABS((float)height) <= 1e-06) {
    (this->Size).Height = 1.0;
    height = 1.0;
  }
  if ((ABS((float)bottomEdgeWidth) <= 1e-06) && (ABS((float)topEdgeWidth) <= 1e-06)) {
    (this->Size).Width = 1.0;
    this->TopEdgeWidth = 1.0;
    bottomEdgeWidth = 1.0;
  }
  fVar1 = SQRT((float)bottomEdgeWidth * (float)bottomEdgeWidth + (float)height * (float)height) *
          0.5;
  fVar2 = -fVar1;
  (this->BBoxSafe).MinEdge.X = fVar2;
  (this->BBoxSafe).MinEdge.Y = fVar2;
  (this->BBoxSafe).MinEdge.Z = fVar2;
  (this->BBoxSafe).MaxEdge.X = fVar1;
  (this->BBoxSafe).MaxEdge.Y = fVar1;
  (this->BBoxSafe).MaxEdge.Z = fVar1;
  return;
}

Assistant:

dimension2d<T> &set(const T &width, const T &height)
	{
		Width = width;
		Height = height;
		return *this;
	}